

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::DecimalFormat::format
          (DecimalFormat *this,double number,UnicodeString *appendTo,FieldPosition *pos)

{
  short sVar1;
  bool bVar2;
  int32_t offset;
  FormattedNumber output;
  UErrorCode localStatus;
  UnicodeStringAppendable appendable;
  undefined1 local_48 [24];
  UnicodeStringAppendable local_30;
  
  if ((pos->fField == -1) && (bVar2 = fastFormatDouble(this,number,appendTo), bVar2)) {
    return appendTo;
  }
  local_48._20_4_ = 0;
  icu_63::number::LocalizedNumberFormatter::formatDouble
            ((LocalizedNumberFormatter *)local_48,number,
             (UErrorCode *)
             (this->fields->formatter).
             super_LocalPointerBase<const_icu_63::number::LocalizedNumberFormatter>.ptr);
  sVar1 = (appendTo->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    offset = (appendTo->fUnion).fFields.fLength;
  }
  else {
    offset = (int)sVar1 >> 5;
  }
  fieldPositionHelper((FormattedNumber *)local_48,pos,offset,(UErrorCode *)(local_48 + 0x14));
  local_30.super_Appendable.super_UObject._vptr_UObject =
       (UObject)&PTR__UnicodeStringAppendable_003dab30;
  local_30.str = appendTo;
  icu_63::number::FormattedNumber::appendTo((FormattedNumber *)local_48,&local_30.super_Appendable);
  UnicodeStringAppendable::~UnicodeStringAppendable(&local_30);
  icu_63::number::FormattedNumber::~FormattedNumber((FormattedNumber *)local_48);
  return appendTo;
}

Assistant:

UnicodeString& DecimalFormat::format(double number, UnicodeString& appendTo, FieldPosition& pos) const {
    if (pos.getField() == FieldPosition::DONT_CARE && fastFormatDouble(number, appendTo)) {
        return appendTo;
    }
    UErrorCode localStatus = U_ZERO_ERROR;
    FormattedNumber output = fields->formatter->formatDouble(number, localStatus);
    fieldPositionHelper(output, pos, appendTo.length(), localStatus);
    auto appendable = UnicodeStringAppendable(appendTo);
    output.appendTo(appendable);
    return appendTo;
}